

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O2

void __thiscall spvtools::opt::LoopDescriptor::~LoopDescriptor(LoopDescriptor *this)

{
  ClearLoops(this);
  std::
  vector<std::pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>_>_>
  ::~vector(&this->loops_to_add_);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->basic_block_to_loop_)._M_h);
  Loop::~Loop(&this->placeholder_top_loop_);
  std::_Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::~_Vector_base
            ((_Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_> *)this);
  return;
}

Assistant:

LoopDescriptor::~LoopDescriptor() { ClearLoops(); }